

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::
BinaryExpr<const___gnu_cxx::__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_&,_const___gnu_cxx::__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_&>
::streamReconstructedExpression
          (BinaryExpr<const___gnu_cxx::__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_&,_const___gnu_cxx::__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_&>
           *this,ostream *os)

{
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  *in_RSI;
  string *in_RDI;
  string *in_stack_ffffffffffffff88;
  ostream *in_stack_ffffffffffffff90;
  StringRef in_stack_ffffffffffffff98;
  string local_30 [48];
  
  Detail::
  stringify<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            (in_RSI);
  Detail::
  stringify<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            (in_RSI);
  formatReconstructedExpression
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff98,in_RDI);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff98);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            formatReconstructedExpression
                    ( os, Catch::Detail::stringify( m_lhs ), m_op, Catch::Detail::stringify( m_rhs ) );
        }